

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

int google::protobuf::compiler::cpp::EstimateAlignmentSize(FieldDescriptor *field)

{
  int iVar1;
  CppType CVar2;
  LogMessage *other;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (field == (FieldDescriptor *)0x0) {
    iVar1 = 0;
  }
  else if ((~(byte)field[1] & 0x60) == 0) {
    iVar1 = 8;
  }
  else {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 - CPPTYPE_INT32 < 10) {
      iVar1 = *(int *)(&DAT_003ce2fc + (ulong)(CVar2 - CPPTYPE_INT32) * 4);
    }
    else {
      internal::LogMessage::LogMessage
                (&local_40,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
                 ,0x1f1);
      other = internal::LogMessage::operator<<(&local_40,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_41,other);
      internal::LogMessage::~LogMessage(&local_40);
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int EstimateAlignmentSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) return 8;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;
  }
  GOOGLE_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}